

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O1

unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
 __thiscall
duckdb::GeoParquetFileMetadata::TryRead
          (GeoParquetFileMetadata *this,FileMetaData *file_meta_data,ClientContext *context)

{
  pointer pKVar1;
  pointer pKVar2;
  char *pcVar3;
  pointer pcVar4;
  _func_void_void_ptr_void_ptr *p_Var5;
  uint64_t *puVar6;
  yyjson_doc *pyVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  void *pvVar11;
  pointer pGVar13;
  uint64_t uVar14;
  yyjson_val *pyVar15;
  InvalidInputException *pIVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  yyjson_val *key;
  yyjson_val *pyVar20;
  ulong uVar21;
  bool bVar22;
  key_type local_d8;
  allocator local_b1;
  yyjson_doc *local_b0;
  ulong local_a8;
  mapped_type *local_a0;
  yyjson_val *local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  yyjson_val *pyVar12;
  
  bVar8 = IsGeoParquetConversionEnabled(context);
  if (!bVar8) goto LAB_01cc8759;
  pKVar1 = (file_meta_data->key_value_metadata).
           super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
           super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (file_meta_data->key_value_metadata).
           super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
           super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar8 = pKVar1 == pKVar2;
  if (bVar8) goto LAB_01cc8759;
  iVar9 = ::std::__cxx11::string::compare((char *)&pKVar1->key);
  while (iVar9 != 0) {
    bVar8 = pKVar1 + 1 == pKVar2;
    if (bVar8) goto LAB_01cc8759;
    iVar9 = ::std::__cxx11::string::compare((char *)&pKVar1[1].key);
    pKVar1 = pKVar1 + 1;
  }
  local_b0 = duckdb_yyjson::yyjson_read_opts
                       ((pKVar1->value)._M_dataplus._M_p,(pKVar1->value)._M_string_length,0,
                        (yyjson_alc *)0x0,(yyjson_read_err *)0x0);
  if (local_b0 == (yyjson_doc *)0x0) {
    (this->write_lock).super___mutex_base._M_mutex.__align = 0;
  }
  else {
    pyVar15 = local_b0->root;
    if ((pyVar15 == (yyjson_val *)0x0) || ((~(uint)pyVar15->tag & 7) != 0)) {
      pIVar16 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"Geoparquet metadata is not an object","");
      InvalidInputException::InvalidInputException(pIVar16,(string *)&local_d8);
      __cxa_throw(pIVar16,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar11 = operator_new(0xa0);
    switchD_01306cb1::default(pvVar11,0,0xa0);
    *(long *)((long)pvVar11 + 0x28) = (long)pvVar11 + 0x38;
    *(undefined4 *)((long)pvVar11 + 0x38) = 0x2e312e31;
    *(undefined2 *)((long)pvVar11 + 0x3c) = 0x30;
    *(undefined8 *)((long)pvVar11 + 0x30) = 5;
    *(long *)((long)pvVar11 + 0x48) = (long)pvVar11 + 0x58;
    *(undefined8 *)((long)pvVar11 + 0x50) = 0;
    *(undefined1 *)((long)pvVar11 + 0x58) = 0;
    *(long *)((long)pvVar11 + 0x68) = (long)pvVar11 + 0x98;
    *(undefined8 *)((long)pvVar11 + 0x70) = 1;
    *(undefined8 *)((long)pvVar11 + 0x78) = 0;
    *(undefined8 *)((long)pvVar11 + 0x80) = 0;
    *(undefined4 *)((long)pvVar11 + 0x88) = 0x3f800000;
    *(undefined8 *)((long)pvVar11 + 0x90) = 0;
    *(undefined8 *)((long)pvVar11 + 0x98) = 0;
    (this->write_lock).super___mutex_base._M_mutex.__align = (long)pvVar11;
    if ((pyVar15 == (yyjson_val *)0x0) ||
       (uVar10 = ~(uint)pyVar15->tag, pyVar12 = (yyjson_val *)(ulong)uVar10, (uVar10 & 7) != 0)) {
LAB_01cc81e9:
      pyVar12 = (yyjson_val *)0x0;
    }
    else {
      bVar22 = pyVar15->tag < 0x100;
      if (!bVar22) {
        pyVar12 = pyVar15 + 1;
        uVar21 = pyVar15->tag >> 8;
        do {
          if (((pyVar12->tag & 0xffffffffffffff00) == 0x700) &&
             (*(int *)((long)(pyVar12->uni).str + 3) == 0x6e6f6973 &&
              *(int *)(pyVar12->uni).str == 0x73726576)) {
            pyVar12 = pyVar12 + 1;
            break;
          }
          uVar14 = 0x10;
          if ((~(uint)pyVar12[1].tag & 6) == 0) {
            uVar14 = pyVar12[1].uni.u64;
          }
          pyVar12 = (yyjson_val *)((long)&pyVar12[1].tag + uVar14);
          uVar21 = uVar21 - 1;
          bVar22 = uVar21 == 0;
        } while (!bVar22);
      }
      if (bVar22) goto LAB_01cc81e9;
    }
    if ((pyVar12 == (yyjson_val *)0x0) || ((pyVar12->tag & 7) != 5)) {
      pIVar16 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"Geoparquet metadata does not have a version","");
      InvalidInputException::InvalidInputException(pIVar16,(string *)&local_d8);
      __cxa_throw(pIVar16,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((pyVar12 == (yyjson_val *)0x0) || ((pyVar12->tag & 7) != 5)) {
      pcVar18 = (char *)0x0;
    }
    else {
      pcVar18 = (pyVar12->uni).str;
    }
    pGVar13 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
              ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                            *)this);
    pcVar3 = (char *)(pGVar13->version)._M_string_length;
    strlen(pcVar18);
    ::std::__cxx11::string::_M_replace((ulong)&pGVar13->version,0,pcVar3,(ulong)pcVar18);
    pGVar13 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
              ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                            *)this);
    pcVar4 = (pGVar13->version)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar4,pcVar4 + (pGVar13->version)._M_string_length);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"2","");
    bVar22 = StringUtil::StartsWith(&local_70,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (bVar22) {
      pIVar16 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"Geoparquet version %s is not supported","");
      pGVar13 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                              *)this);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar4 = (pGVar13->version)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar4,pcVar4 + (pGVar13->version)._M_string_length);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar16,&local_d8,&local_50);
      __cxa_throw(pIVar16,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((pyVar15 == (yyjson_val *)0x0) ||
       (uVar10 = ~(uint)pyVar15->tag, pyVar12 = (yyjson_val *)(ulong)uVar10, (uVar10 & 7) != 0)) {
LAB_01cc8371:
      pyVar12 = (yyjson_val *)0x0;
    }
    else {
      bVar22 = pyVar15->tag < 0x100;
      if (!bVar22) {
        pyVar12 = pyVar15 + 1;
        uVar21 = pyVar15->tag >> 8;
        do {
          if (((pyVar12->tag & 0xffffffffffffff00) == 0xe00) &&
             (*(long *)((long)(pyVar12->uni).str + 6) == 0x6e6d756c6f635f79 &&
              *(long *)(pyVar12->uni).str == 0x5f7972616d697270)) {
            pyVar12 = pyVar12 + 1;
            break;
          }
          uVar14 = 0x10;
          if ((~(uint)pyVar12[1].tag & 6) == 0) {
            uVar14 = pyVar12[1].uni.u64;
          }
          pyVar12 = (yyjson_val *)((long)&pyVar12[1].tag + uVar14);
          uVar21 = uVar21 - 1;
          bVar22 = uVar21 == 0;
        } while (!bVar22);
      }
      if (bVar22) goto LAB_01cc8371;
    }
    if ((pyVar12 == (yyjson_val *)0x0) || ((pyVar12->tag & 7) != 5)) {
      pIVar16 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"Geoparquet metadata does not have a primary column","");
      InvalidInputException::InvalidInputException(pIVar16,(string *)&local_d8);
      __cxa_throw(pIVar16,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((pyVar12 == (yyjson_val *)0x0) || ((pyVar12->tag & 7) != 5)) {
      pcVar18 = (char *)0x0;
    }
    else {
      pcVar18 = (pyVar12->uni).str;
    }
    pGVar13 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
              ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                            *)this);
    pcVar3 = (char *)(pGVar13->primary_geometry_column)._M_string_length;
    strlen(pcVar18);
    ::std::__cxx11::string::_M_replace
              ((ulong)&pGVar13->primary_geometry_column,0,pcVar3,(ulong)pcVar18);
    if ((pyVar15 == (yyjson_val *)0x0) || ((~(uint)pyVar15->tag & 7) != 0)) {
LAB_01cc8468:
      pyVar15 = (yyjson_val *)0x0;
    }
    else {
      puVar6 = &pyVar15->tag;
      bVar22 = *puVar6 < 0x100;
      if (!bVar22) {
        pyVar15 = pyVar15 + 1;
        uVar21 = *puVar6 >> 8;
        do {
          if (((pyVar15->tag & 0xffffffffffffff00) == 0x700) &&
             (*(int *)((long)(pyVar15->uni).str + 3) == 0x736e6d75 &&
              *(int *)(pyVar15->uni).str == 0x756c6f63)) {
            pyVar15 = pyVar15 + 1;
            break;
          }
          uVar14 = 0x10;
          if ((~(uint)pyVar15[1].tag & 6) == 0) {
            uVar14 = pyVar15[1].uni.u64;
          }
          pyVar15 = (yyjson_val *)((long)&pyVar15[1].tag + uVar14);
          uVar21 = uVar21 - 1;
          bVar22 = uVar21 == 0;
        } while (!bVar22);
      }
      if (bVar22) goto LAB_01cc8468;
    }
    if ((pyVar15 == (yyjson_val *)0x0) || ((~(uint)pyVar15->tag & 7) != 0)) {
      pIVar16 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"Geoparquet metadata does not have a columns object","");
      InvalidInputException::InvalidInputException(pIVar16,(string *)&local_d8);
      __cxa_throw(pIVar16,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((pyVar15 == (yyjson_val *)0x0) || ((~(uint)pyVar15->tag & 7) != 0)) {
      pyVar15 = (yyjson_val *)0x0;
      local_a8 = 0;
    }
    else {
      local_a8 = pyVar15->tag >> 8;
      pyVar15 = pyVar15 + 1;
    }
    uVar21 = 0;
    while( true ) {
      pyVar7 = local_b0;
      if (uVar21 < local_a8) {
        uVar14 = 0x10;
        if ((~(uint)pyVar15[1].tag & 6) == 0) {
          uVar14 = pyVar15[1].uni.u64;
        }
        uVar21 = uVar21 + 1;
        pyVar12 = (yyjson_val *)((long)&pyVar15[1].tag + uVar14);
        pyVar20 = pyVar15;
      }
      else {
        pyVar20 = (yyjson_val *)0x0;
        pyVar12 = pyVar15;
      }
      if (pyVar20 == (yyjson_val *)0x0) break;
      if ((pyVar20->tag & 7) == 5) {
        pcVar18 = (pyVar20->uni).str;
      }
      else {
        pcVar18 = (char *)0x0;
      }
      local_98 = pyVar12;
      pGVar13 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                ::operator->((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                              *)this);
      ::std::__cxx11::string::string((string *)&local_d8,pcVar18,&local_b1);
      local_a0 = ::std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::GeoParquetColumnMetadata>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pGVar13->geometry_columns,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      uVar10 = ~(uint)pyVar20[1].tag;
      pyVar15 = (yyjson_val *)(ulong)uVar10;
      if ((uVar10 & 7) != 0) {
        pIVar16 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"Geoparquet column \'%s\' is not an object","");
        InvalidInputException::InvalidInputException<char_const*>(pIVar16,&local_d8,pcVar18);
        __cxa_throw(pIVar16,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar19 = pyVar20[1].tag;
      uVar10 = (uint)uVar19 & 7;
      if (uVar10 == 7) {
        bVar22 = uVar19 < 0x100;
        if (!bVar22) {
          pyVar15 = pyVar20 + 2;
          uVar17 = uVar19 >> 8;
          do {
            if (((pyVar15->tag & 0xffffffffffffff00) == 0x800) &&
               (*(long *)(pyVar15->uni).str == 0x676e69646f636e65)) {
              pyVar15 = pyVar15 + 1;
              break;
            }
            uVar14 = 0x10;
            if ((~(uint)pyVar15[1].tag & 6) == 0) {
              uVar14 = pyVar15[1].uni.u64;
            }
            pyVar15 = (yyjson_val *)((long)&pyVar15[1].tag + uVar14);
            uVar17 = uVar17 - 1;
            bVar22 = uVar17 == 0;
          } while (!bVar22);
        }
        if (bVar22) goto LAB_01cc85df;
      }
      else {
LAB_01cc85df:
        pyVar15 = (yyjson_val *)0x0;
      }
      if ((pyVar15 == (yyjson_val *)0x0) || ((pyVar15->tag & 7) != 5)) {
        pIVar16 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"Geoparquet column \'%s\' does not have an encoding","");
        InvalidInputException::InvalidInputException<char_const*>(pIVar16,&local_d8,pcVar18);
        __cxa_throw(pIVar16,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar9 = strcmp((pyVar15->uni).str,"WKB");
      if (iVar9 != 0) {
        pIVar16 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"Geoparquet column \'%s\' has an unsupported encoding","");
        InvalidInputException::InvalidInputException<char_const*>(pIVar16,&local_d8,pcVar18);
        __cxa_throw(pIVar16,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_a0->geometry_encoding = WKB;
      if (uVar10 == 7) {
        bVar22 = uVar19 < 0x100;
        if (!bVar22) {
          pyVar20 = pyVar20 + 2;
          uVar19 = uVar19 >> 8;
          do {
            if (((pyVar20->tag & 0xffffffffffffff00) == 0xe00) &&
               (*(long *)((long)(pyVar20->uni).str + 6) == 0x73657079745f7972 &&
                *(long *)(pyVar20->uni).str == 0x797274656d6f6567)) {
              pyVar20 = pyVar20 + 1;
              break;
            }
            uVar14 = 0x10;
            if ((~(uint)pyVar20[1].tag & 6) == 0) {
              uVar14 = pyVar20[1].uni.u64;
            }
            pyVar20 = (yyjson_val *)((long)&pyVar20[1].tag + uVar14);
            uVar19 = uVar19 - 1;
            bVar22 = uVar19 == 0;
          } while (!bVar22);
        }
        if (bVar22) goto LAB_01cc869e;
      }
      else {
LAB_01cc869e:
        pyVar20 = (yyjson_val *)0x0;
      }
      if ((pyVar20 == (yyjson_val *)0x0) || (pyVar15 = local_98, (pyVar20->tag & 7) != 6)) {
        pIVar16 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"Geoparquet column \'%s\' does not have geometry types","");
        InvalidInputException::InvalidInputException<char_const*>(pIVar16,&local_d8,pcVar18);
        __cxa_throw(pIVar16,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    p_Var5 = (local_b0->alc).free;
    pvVar11 = (local_b0->alc).ctx;
    (local_b0->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
    (local_b0->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
    (local_b0->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
    (local_b0->alc).ctx = (void *)0x0;
    if (local_b0->str_pool != (char *)0x0) {
      (*p_Var5)(pvVar11,local_b0->str_pool);
    }
    (*p_Var5)(pvVar11,pyVar7);
  }
  if (!bVar8) {
    return (unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
            )(unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
              )this;
  }
LAB_01cc8759:
  (this->write_lock).super___mutex_base._M_mutex.__align = 0;
  return (unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
          )(unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
            )this;
}

Assistant:

unique_ptr<GeoParquetFileMetadata> GeoParquetFileMetadata::TryRead(const duckdb_parquet::FileMetaData &file_meta_data,
                                                                   const ClientContext &context) {

	// Conversion not enabled, or spatial is not loaded!
	if (!IsGeoParquetConversionEnabled(context)) {
		return nullptr;
	}

	for (auto &kv : file_meta_data.key_value_metadata) {
		if (kv.key == "geo") {
			const auto geo_metadata = yyjson_read(kv.value.c_str(), kv.value.size(), 0);
			if (!geo_metadata) {
				// Could not parse the JSON
				return nullptr;
			}

			try {
				// Check the root object
				const auto root = yyjson_doc_get_root(geo_metadata);
				if (!yyjson_is_obj(root)) {
					throw InvalidInputException("Geoparquet metadata is not an object");
				}

				auto result = make_uniq<GeoParquetFileMetadata>();

				// Check and parse the version
				const auto version_val = yyjson_obj_get(root, "version");
				if (!yyjson_is_str(version_val)) {
					throw InvalidInputException("Geoparquet metadata does not have a version");
				}
				result->version = yyjson_get_str(version_val);
				if (StringUtil::StartsWith(result->version, "2")) {
					// Guard against a breaking future 2.0 version
					throw InvalidInputException("Geoparquet version %s is not supported", result->version);
				}

				// Check and parse the primary geometry column
				const auto primary_geometry_column_val = yyjson_obj_get(root, "primary_column");
				if (!yyjson_is_str(primary_geometry_column_val)) {
					throw InvalidInputException("Geoparquet metadata does not have a primary column");
				}
				result->primary_geometry_column = yyjson_get_str(primary_geometry_column_val);

				// Check and parse the geometry columns
				const auto columns_val = yyjson_obj_get(root, "columns");
				if (!yyjson_is_obj(columns_val)) {
					throw InvalidInputException("Geoparquet metadata does not have a columns object");
				}

				// Iterate over all geometry columns
				yyjson_obj_iter iter = yyjson_obj_iter_with(columns_val);
				yyjson_val *column_key;

				while ((column_key = yyjson_obj_iter_next(&iter))) {
					const auto column_val = yyjson_obj_iter_get_val(column_key);
					const auto column_name = yyjson_get_str(column_key);

					auto &column = result->geometry_columns[column_name];

					if (!yyjson_is_obj(column_val)) {
						throw InvalidInputException("Geoparquet column '%s' is not an object", column_name);
					}

					// Parse the encoding
					const auto encoding_val = yyjson_obj_get(column_val, "encoding");
					if (!yyjson_is_str(encoding_val)) {
						throw InvalidInputException("Geoparquet column '%s' does not have an encoding", column_name);
					}
					const auto encoding_str = yyjson_get_str(encoding_val);
					if (strcmp(encoding_str, "WKB") == 0) {
						column.geometry_encoding = GeoParquetColumnEncoding::WKB;
					} else {
						throw InvalidInputException("Geoparquet column '%s' has an unsupported encoding", column_name);
					}

					// Parse the geometry types
					const auto geometry_types_val = yyjson_obj_get(column_val, "geometry_types");
					if (!yyjson_is_arr(geometry_types_val)) {
						throw InvalidInputException("Geoparquet column '%s' does not have geometry types", column_name);
					}
					// We dont care about the geometry types for now.

					// TODO: Parse the bounding box, other metadata that might be useful.
					// (Only encoding and geometry types are required to be present)
				}

				// Return the result
				// Make sure to free the JSON document
				yyjson_doc_free(geo_metadata);
				return result;

			} catch (...) {
				// Make sure to free the JSON document in case of an exception
				yyjson_doc_free(geo_metadata);
				throw;
			}
		}
	}
	return nullptr;
}